

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen_tools.h
# Opt level: O0

void __thiscall
fmt::v10::formatter<Eigen::Transpose<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_char,_void>::formatter
          (formatter<Eigen::Transpose<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_char,_void> *this)

{
  formatter<Eigen::Transpose<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_char,_void> *this_local;
  
  this->precision = 4;
  return;
}

Assistant:

constexpr auto parse(const format_parse_context& ctx) {
    const auto* it = ctx.begin();
    const auto* end = ctx.end();

    if (it != end && *it == '.') {
      // Support precision:
      ++it;
      auto start = it;
      while (is_digit(*it) && it != end) {
        ++it;
      }
      precision = parse_unsigned_int(start, it);
    } else {
      precision = 4;
    }

    if (it != end && *it != '}') {
      throw format_error("invalid format");
    }

    return it;
  }